

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Member.cpp
# Opt level: O0

void __thiscall
psy::C::MemberDeclarationSymbol::MemberDeclarationImpl::MemberDeclarationImpl
          (MemberDeclarationImpl *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope)

{
  Scope *enclosingScope_local;
  SyntaxTree *tree_local;
  Symbol *containingSym_local;
  SymbolKind symK_local;
  MemberDeclarationImpl *this_local;
  
  DeclarationSymbol::DeclarationImpl::DeclarationImpl
            (&this->super_DeclarationImpl,symK,containingSym,tree,enclosingScope,Members);
  this->name_ = (Identifier *)0x0;
  this->ty_ = (Type *)0x0;
  return;
}

Assistant:

MemberDeclarationImpl(SymbolKind symK,
                          const Symbol* containingSym,
                          const SyntaxTree* tree,
                          const Scope* enclosingScope)
        : DeclarationImpl(symK,
                          containingSym,
                          tree,
                          enclosingScope,
                          NameSpace::Members)
        , name_(nullptr)
        , ty_(nullptr)
    {}